

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

void buffer_munmap(uint32_t id)

{
  cpu_mapping *__s;
  cpu_mapping *mapping;
  uint32_t id_local;
  
  __s = get_cpu_mapping(id);
  if (((__s != (cpu_mapping *)0x0) && (__s->object == (gpu_object *)0x0)) &&
     (__s->next == (cpu_mapping *)0x0)) {
    free(__s->data);
    memset(__s,0xff,0x100);
    free(__s);
    set_cpu_mapping(id,(cpu_mapping *)0x0);
    return;
  }
  fprintf(_stdout,"ERROR: inconsistent mapping data%s\n","");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  demmt_abort();
}

Assistant:

void buffer_munmap(uint32_t id)
{
	struct cpu_mapping *mapping = get_cpu_mapping(id);
	if (!mapping || mapping->object || mapping->next)
	{
		mmt_error("inconsistent mapping data%s\n", "");
		demmt_abort();
	}
	free(mapping->data);
	// catch use-after-free bugs ASAP
	memset(mapping, 0xff, sizeof(*mapping));
	free(mapping);
	set_cpu_mapping(id, NULL);
}